

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

bool overlapCC(SoftCluster *c1,SoftCluster *c2)

{
  pointer pSVar1;
  int iVar2;
  iterator iVar3;
  reference pvVar4;
  long lVar5;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  pointer pSVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  vector<SoftNode,_std::allocator<SoftNode>_> down3;
  vector<SoftNode,_std::allocator<SoftNode>_> down;
  vector<SoftNode,_std::allocator<SoftNode>_> up;
  vector<SoftNode,_std::allocator<SoftNode>_> up3;
  SoftNode sn;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stDown;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stUp;
  SoftNode n2;
  
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&up,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c1->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&sn);
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)&down,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_start,
             (c2->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&sn);
  pSVar7 = up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  stUp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stUp._M_t._M_impl.super__Rb_tree_header._M_header;
  stUp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stUp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stUp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stDown._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &stDown._M_t._M_impl.super__Rb_tree_header._M_header;
  stDown._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  stDown._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  stDown._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  stDown._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stDown._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  stUp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       stUp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pSVar6 = up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar1 = down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_finish, pSVar6 != pSVar7; pSVar6 = pSVar6 + 1) {
    SoftNode::SoftNode(&sn,pSVar6);
    if (sn.isSC == false) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&stUp,&sn.readName);
    }
    SoftNode::~SoftNode(&sn);
  }
  for (pSVar7 = down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar6 = up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_finish, pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
    SoftNode::SoftNode(&sn,pSVar7);
    if (sn.isSC == false) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&stDown,&sn.readName);
    }
    SoftNode::~SoftNode(&sn);
  }
  iVar11 = 0;
  for (pSVar7 = up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar1 = down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_finish, pSVar7 != pSVar6; pSVar7 = pSVar7 + 1) {
    SoftNode::SoftNode(&sn,pSVar7);
    if (sn.isSC == true) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&stDown._M_t,&sn.readName);
      iVar11 = iVar11 + (uint)((_Rb_tree_header *)iVar3._M_node !=
                              &stDown._M_t._M_impl.super__Rb_tree_header);
    }
    SoftNode::~SoftNode(&sn);
  }
  for (pSVar7 = down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
    SoftNode::SoftNode(&sn,pSVar7);
    if (sn.isSC == true) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&stUp._M_t,&sn.readName);
      iVar11 = iVar11 + (uint)((_Rb_tree_header *)iVar3._M_node !=
                              &stUp._M_t._M_impl.super__Rb_tree_header);
    }
    SoftNode::~SoftNode(&sn);
  }
  bVar8 = true;
  if (iVar11 < MIN_SPLIT_SUPPORT) {
    up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    uVar10 = ((long)up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x78 & 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      if ((int)(uint)uVar10 < 0) break;
      uVar12 = (ulong)((uint)uVar10 & 0x7fffffff);
      pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at(&up,uVar12);
      if (pvVar4->isSC == true) {
        pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at(&up,uVar12);
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&up3,pvVar4);
      }
    } while ((ulong)(((long)up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x78) < 3);
    uVar10 = ((long)down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)down.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x78 & 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      if ((int)(uint)uVar10 < 0) break;
      uVar12 = (ulong)((uint)uVar10 & 0x7fffffff);
      pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at(&down,uVar12);
      if (pvVar4->isSC == true) {
        pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at(&down,uVar12);
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&down3,pvVar4);
      }
    } while ((ulong)(((long)down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x78) < 3);
    pSVar7 = up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar11 = 0;
    for (pSVar6 = up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                  super__Vector_impl_data._M_start; pSVar6 != pSVar7; pSVar6 = pSVar6 + 1) {
      SoftNode::SoftNode(&sn,pSVar6);
      pSVar1 = down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pSVar9 = down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                    super__Vector_impl_data._M_start; pSVar9 != pSVar1; pSVar9 = pSVar9 + 1) {
        SoftNode::SoftNode(&n2,pSVar9);
        iVar2 = alignSeq(&sn.seq,&n2.seq);
        iVar11 = iVar11 + iVar2;
        SoftNode::~SoftNode(&n2);
      }
      SoftNode::~SoftNode(&sn);
    }
    lVar5 = ((long)down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x78 +
            ((long)up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)up3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x78;
    auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar13._0_8_ = lVar5;
    auVar13._12_4_ = 0x45300000;
    bVar8 = (double)INTRA_ALIGN_SCORE <=
            (double)iVar11 /
            ((auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&down3);
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&up3);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&stDown._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&stUp._M_t);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&down);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector(&up);
  return bVar8;
}

Assistant:

bool overlapCC(const SoftCluster &c1, const SoftCluster &c2)
{
	int sum = 0;
	std::vector<SoftNode> up(c1.nodes.begin(), c1.nodes.end());
	std::vector<SoftNode> down(c2.nodes.begin(), c2.nodes.end());

	// check if split read already present
	std::set<std::string> stUp, stDown;
	for (SoftNode sn : up)
	{
		if (!sn.isSC)
			stUp.insert(sn.readName);
	}
	for (SoftNode sn : down)
	{
		if (!sn.isSC)
			stDown.insert(sn.readName);
	}
	int srCo = 0;
	for (SoftNode sn : up)
	{
		if (sn.isSC)
		{
			if (stDown.find(sn.readName) != stDown.end())
				srCo += 1;
		}
	}
	for (SoftNode sn : down)
	{
		if (sn.isSC)
		{
			if (stUp.find(sn.readName) != stUp.end())
				srCo += 1;
		}
	}
	if (srCo >= MIN_SPLIT_SUPPORT)
		return true;

	std::vector<SoftNode> up3, down3;
	for (int i = up.size() - 1; i >= 0; i--)
	{
		if (up.at(i).isSC)
			up3.emplace_back(up.at(i));
		if (up3.size() >= 3)
			break;
	}
	for (int i = down.size() - 1; i >= 0; i--)
	{
		if (down.at(i).isSC)
			down3.emplace_back(down.at(i));
		if (down3.size() >= 3)
			break;
	}

	for (SoftNode n1 : up3)
	{
		for (SoftNode n2 : down3)
		{
			int here = alignSeq(n1.seq, n2.seq);
			sum += here;
		}
	}
	double avgScore = 1.0 * sum / (up3.size() + down3.size());
	return avgScore >= INTRA_ALIGN_SCORE;
}